

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall HighsLpRelaxation::removeCuts(HighsLpRelaxation *this)

{
  int iVar1;
  HighsInt from_row;
  pointer pLVar2;
  long lVar3;
  long lVar4;
  size_type __new_size;
  bool bVar5;
  
  iVar1 = (this->lpsolver).model_.lp_.num_row_;
  from_row = this->mipsolver->model_->num_row_;
  Highs::deleteRows(&this->lpsolver,from_row,iVar1 + -1);
  __new_size = (size_type)from_row;
  lVar3 = (long)iVar1 - __new_size;
  lVar4 = __new_size * 0xc + 4;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    pLVar2 = (this->lprows).
             super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)pLVar2 + lVar4 + -4) == 1) {
      HighsCutPool::lpCutRemoved
                (&((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                 *(HighsInt *)((long)&pLVar2->origin + lVar4));
    }
    lVar4 = lVar4 + 0xc;
  }
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
            (&this->lprows,__new_size);
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts() {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt nlprows = lpsolver.getNumRow();
  HighsInt modelrows = mipsolver.numRow();

  lpsolver.deleteRows(modelrows, nlprows - 1);
  for (HighsInt i = modelrows; i != nlprows; ++i) {
    if (lprows[i].origin == LpRow::Origin::kCutPool)
      mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
  }
  lprows.resize(modelrows);
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
}